

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  void *this;
  anon_class_8_1_cd7eca6d local_380;
  Handler local_378;
  anon_class_8_1_cd7eca6d local_358;
  Handler local_350;
  anon_class_8_1_cd7eca6d local_330;
  Handler local_328;
  anon_class_8_1_cd7eca6d local_308;
  Handler local_300;
  undefined1 local_2e0 [8];
  Server srv;
  undefined1 local_1c0 [8];
  TSpellCorrector corrector;
  string local_98;
  int local_78;
  allocator local_71;
  int port;
  string hostname;
  allocator local_39;
  undefined1 local_38 [8];
  string modelFile;
  char **argv_local;
  int argc_local;
  
  modelFile.field_2._8_8_ = argv;
  if (argc == 4) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_38,pcVar1,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    pcVar1 = *(char **)(modelFile.field_2._8_8_ + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&port,pcVar1,&local_71);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    pcVar1 = *(char **)(modelFile.field_2._8_8_ + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_98,pcVar1,(allocator *)((long)&corrector.MaxCandiatesToCheck + 7));
    iVar3 = std::__cxx11::stoi(&local_98,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)((long)&corrector.MaxCandiatesToCheck + 7));
    local_78 = iVar3;
    NJamSpell::TSpellCorrector::TSpellCorrector((TSpellCorrector *)local_1c0);
    poVar4 = std::operator<<((ostream *)&std::cerr,"[info] loading model");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    bVar2 = NJamSpell::TSpellCorrector::LoadLangModel
                      ((TSpellCorrector *)local_1c0,(string *)local_38);
    if (bVar2) {
      httplib::Server::Server((Server *)local_2e0);
      local_308.corrector = (TSpellCorrector *)local_1c0;
      std::function<void(httplib::Request_const&,httplib::Response&)>::function<main::__0,void>
                ((function<void(httplib::Request_const&,httplib::Response&)> *)&local_300,&local_308
                );
      httplib::Server::Get((Server *)local_2e0,"/fix",&local_300);
      std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::~function(&local_300);
      local_330.corrector = (TSpellCorrector *)local_1c0;
      std::function<void(httplib::Request_const&,httplib::Response&)>::function<main::__1,void>
                ((function<void(httplib::Request_const&,httplib::Response&)> *)&local_328,&local_330
                );
      httplib::Server::Post((Server *)local_2e0,"/fix",&local_328);
      std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::~function(&local_328);
      local_358.corrector = (TSpellCorrector *)local_1c0;
      std::function<void(httplib::Request_const&,httplib::Response&)>::function<main::__2,void>
                ((function<void(httplib::Request_const&,httplib::Response&)> *)&local_350,&local_358
                );
      httplib::Server::Get((Server *)local_2e0,"/candidates",&local_350);
      std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::~function(&local_350);
      local_380.corrector = (TSpellCorrector *)local_1c0;
      std::function<void(httplib::Request_const&,httplib::Response&)>::function<main::__3,void>
                ((function<void(httplib::Request_const&,httplib::Response&)> *)&local_378,&local_380
                );
      httplib::Server::Post((Server *)local_2e0,"/candidates",&local_378);
      std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::~function(&local_378);
      poVar4 = std::operator<<((ostream *)&std::cerr,"[info] starting web server at ");
      poVar4 = std::operator<<(poVar4,(string *)&port);
      poVar4 = std::operator<<(poVar4,":");
      this = (void *)std::ostream::operator<<(poVar4,local_78);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      iVar3 = std::__cxx11::string::c_str();
      httplib::Server::listen((Server *)local_2e0,iVar3,local_78);
      argv_local._4_4_ = 0;
      srv._276_4_ = 1;
      httplib::Server::~Server((Server *)local_2e0);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"[error] failed to load model");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 0x2a;
      srv._276_4_ = 1;
    }
    NJamSpell::TSpellCorrector::~TSpellCorrector((TSpellCorrector *)local_1c0);
    std::__cxx11::string::~string((string *)&port);
    std::__cxx11::string::~string((string *)local_38);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar4 = std::operator<<(poVar4,*(char **)modelFile.field_2._8_8_);
    std::operator<<(poVar4," model.bin localhost 8080\n");
    argv_local._4_4_ = 0x2a;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char** argv) {
    if (argc != 4) {
        std::cerr << "Usage: " << argv[0] << " model.bin localhost 8080\n";
        return 42;
    }

    std::string modelFile = argv[1];
    std::string hostname = argv[2];
    int port = std::stoi(argv[3]);

    NJamSpell::TSpellCorrector corrector;
    std::cerr << "[info] loading model" << std::endl;
    if (!corrector.LoadLangModel(modelFile)) {
        std::cerr << "[error] failed to load model" << std::endl;
        return 42;
    }

    httplib::Server srv;
    srv.Get("/fix", [&corrector](const httplib::Request& req, httplib::Response& resp) {
        resp.set_content(FixText(corrector, req.get_param_value("text")) + "\n", "text/plain");
    });

    srv.Post("/fix", [&corrector](const httplib::Request& req, httplib::Response& resp) {
        resp.set_content(FixText(corrector, req.body) + "\n", "text/plain");
    });

    srv.Get("/candidates", [&corrector](const httplib::Request& req, httplib::Response& resp) {
        resp.set_content(GetCandidates(corrector, req.get_param_value("text")) + "\n", "text/plain");
    });

    srv.Post("/candidates", [&corrector](const httplib::Request& req, httplib::Response& resp) {
        resp.set_content(GetCandidates(corrector, req.body) + "\n", "text/plain");
    });

    std::cerr << "[info] starting web server at " << hostname << ":" << port << std::endl;
    srv.listen(hostname.c_str(), port);
    return 0;
}